

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.hh
# Opt level: O0

uint64_t phosg::bswap64(uint64_t a)

{
  uint64_t a_local;
  
  return a >> 0x38 | a >> 0x28 & 0xff00 | a >> 0x18 & 0xff0000 | a >> 8 & 0xff000000 |
         (a & 0xff000000) << 8 | (a & 0xff0000) << 0x18 | (a & 0xff00) << 0x28 | a << 0x38;
}

Assistant:

static inline uint64_t bswap64(uint64_t a) {
  return ((a >> 56) & 0x00000000000000FF) |
      ((a >> 40) & 0x000000000000FF00) |
      ((a >> 24) & 0x0000000000FF0000) |
      ((a >> 8) & 0x00000000FF000000) |
      ((a << 8) & 0x000000FF00000000) |
      ((a << 24) & 0x0000FF0000000000) |
      ((a << 40) & 0x00FF000000000000) |
      ((a << 56) & 0xFF00000000000000);
}